

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O1

int __thiscall
amrex::EB2::
GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>::
getBoxType_Cpu(GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>,_int>
               *this,Box *bx,Geometry *geom)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Real RVar14;
  int local_74;
  RealArray local_48;
  
  iVar5 = ((bx->bigend).vect[2] - (bx->smallend).vect[2]) + 1;
  bVar3 = 0 < iVar5;
  if (iVar5 < 1) {
    uVar10 = 0xffffffff;
  }
  else {
    iVar6 = ((bx->bigend).vect[0] - (bx->smallend).vect[0]) + 1;
    iVar8 = ((bx->bigend).vect[1] - (bx->smallend).vect[1]) + 1;
    iVar12 = 0;
    local_74 = 0;
    iVar11 = 0;
    do {
      bVar4 = 0 < iVar8;
      if (0 < iVar8) {
        iVar9 = 0;
        do {
          bVar2 = 0 < iVar6;
          if (0 < iVar6) {
            iVar13 = 0;
            do {
              uVar1 = *(undefined8 *)(bx->smallend).vect;
              local_48._M_elems[0] =
                   (double)(iVar13 + (int)uVar1) * (geom->super_CoordSys).dx[0] +
                   (geom->prob_domain).xlo[0];
              local_48._M_elems[1] =
                   (double)(iVar9 + (int)((ulong)uVar1 >> 0x20)) * (geom->super_CoordSys).dx[1] +
                   (geom->prob_domain).xlo[1];
              local_48._M_elems[2] =
                   (double)((bx->smallend).vect[2] + iVar12) * (geom->super_CoordSys).dx[2] +
                   (geom->prob_domain).xlo[2];
              RVar14 = DifferenceIF<amrex::EB2::CylinderIF,_amrex::EB2::CylinderIF>::operator()
                                 (&this->m_f,&local_48);
              if ((RVar14 != 0.0) || (NAN(RVar14))) {
                if (RVar14 <= 0.0) {
                  local_74 = local_74 + 1;
                }
                else {
                  iVar11 = iVar11 + 1;
                }
              }
              if ((0 < iVar11) && (0 < local_74)) break;
              iVar13 = iVar13 + 1;
              bVar2 = iVar13 < iVar6;
            } while (iVar13 != iVar6);
          }
          if (bVar2) break;
          iVar9 = iVar9 + 1;
          bVar4 = iVar9 < iVar8;
        } while (iVar9 != iVar8);
      }
      if (bVar4) break;
      iVar12 = iVar12 + 1;
      bVar3 = iVar12 < iVar5;
    } while (iVar12 != iVar5);
    uVar10 = -(uint)(iVar11 == 0) | (uint)(local_74 == 0);
  }
  uVar7 = 0;
  if (!bVar3) {
    uVar7 = uVar10;
  }
  return uVar7;
}

Assistant:

int getBoxType_Cpu (const Box& bx, Geometry const& geom) const noexcept
    {
        const Real* problo = geom.ProbLo();
        const Real* dx = geom.CellSize();
        const auto& len3 = bx.length3d();
        const int* blo = bx.loVect();
        int nbody = 0, nzero = 0, nfluid = 0;
        for         (int k = 0; k < len3[2]; ++k) {
            for     (int j = 0; j < len3[1]; ++j) {
                for (int i = 0; i < len3[0]; ++i) {
                    RealArray xyz {AMREX_D_DECL(problo[0]+(i+blo[0])*dx[0],
                                                problo[1]+(j+blo[1])*dx[1],
                                                problo[2]+(k+blo[2])*dx[2])};
                    Real v = m_f(xyz);
                    if (v == 0.0_rt) {
                        ++nzero;
                    } else if (v > 0.0_rt) {
                        ++nbody;
                    } else {
                        ++nfluid;
                    }
                    if (nbody > 0 && nfluid > 0) return mixedcells;
                }
            }
        }

        if (nbody == 0) {
            return allregular;
        } else if (nfluid == 0) {
            return allcovered;
        } else {
            return mixedcells;
        }
    }